

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.h
# Opt level: O2

void asmjit::v1_14::Support::Internal::
     bitVectorOp<unsigned_long,asmjit::v1_14::Support::AndNot,asmjit::v1_14::Support::SetNot>
               (unsigned_long *buf,size_t index,size_t count)

{
  uint uVar1;
  ulong *puVar2;
  ulong uVar3;
  
  if (count != 0) {
    uVar1 = (uint)index & 0x3f;
    uVar3 = 0x40 - (ulong)uVar1;
    if (count <= uVar3) {
      uVar3 = count;
    }
    puVar2 = buf + (index >> 6);
    *puVar2 = *puVar2 & ~((0xffffffffffffffffU >> (-(char)uVar3 & 0x3fU)) << (sbyte)uVar1);
    for (uVar3 = count - uVar3; puVar2 = puVar2 + 1, 0x3f < uVar3; uVar3 = uVar3 - 0x40) {
      *puVar2 = 0;
    }
    if (uVar3 != 0) {
      *puVar2 = *puVar2 & ~(0xffffffffffffffffU >> (-(char)uVar3 & 0x3fU));
    }
  }
  return;
}

Assistant:

static ASMJIT_FORCE_INLINE void bitVectorOp(T* buf, size_t index, size_t count) noexcept {
    if (count == 0)
      return;

    const size_t kTSizeInBits = bitSizeOf<T>();
    size_t vecIndex = index / kTSizeInBits; // T[]
    size_t bitIndex = index % kTSizeInBits; // T[][]

    buf += vecIndex;

    // The first BitWord requires special handling to preserve bits outside the fill region.
    const T kFillMask = allOnes<T>();
    size_t firstNBits = min<size_t>(kTSizeInBits - bitIndex, count);

    buf[0] = OperatorT::op(buf[0], (kFillMask >> (kTSizeInBits - firstNBits)) << bitIndex);
    buf++;
    count -= firstNBits;

    // All bits between the first and last affected BitWords can be just filled.
    while (count >= kTSizeInBits) {
      buf[0] = FullWordOpT::op(buf[0], kFillMask);
      buf++;
      count -= kTSizeInBits;
    }

    // The last BitWord requires special handling as well
    if (count)
      buf[0] = OperatorT::op(buf[0], kFillMask >> (kTSizeInBits - count));
  }